

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

void __thiscall
slang::ast::Compilation::insertDefinition(Compilation *this,Symbol *symbol,Scope *scope)

{
  size_t *psVar1;
  long lVar2;
  group_type_pointer pgVar3;
  pointer *pppSVar4;
  RootSymbol *pRVar5;
  ulong uVar6;
  Symbol *this_00;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  bool bVar11;
  Diagnostic *pDVar12;
  SourceLibrary *pSVar13;
  SourceLibrary *pSVar14;
  SyntaxNode *pSVar15;
  uint uVar16;
  SourceLocation SVar17;
  Scope *pSVar18;
  ulong uVar19;
  Diagnostic *pDVar20;
  value_type_pointer unaff_RBX;
  value_type_pointer ppVar21;
  Scope *pSVar22;
  Scope *__u;
  const_iterator __position;
  int iVar23;
  SourceLocation SVar24;
  slot_type *psVar25;
  ulong uVar26;
  group_type_pointer pgVar27;
  SourceLocation SVar28;
  Diagnostic *pDVar29;
  pointer ppSVar30;
  pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool> *ppVar31;
  Compilation *hash;
  value_type_pointer ppVar32;
  _Head_base<1UL,_const_slang::ast::Scope_*,_false> _Var33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  uchar uVar37;
  uchar uVar38;
  uchar uVar39;
  uchar uVar40;
  uchar uVar41;
  uchar uVar42;
  uchar uVar43;
  uchar uVar44;
  uchar uVar45;
  uchar uVar46;
  uchar uVar47;
  uchar uVar48;
  uchar uVar49;
  uchar uVar50;
  uchar uVar51;
  uchar uVar52;
  initializer_list<slang::ast::Symbol_*> __l;
  string_view name;
  DiagCode in_stack_fffffffffffffeb8;
  try_emplace_args_t local_139;
  SourceLocation local_138;
  Diagnostic *local_130;
  pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool> *local_128;
  Scope *local_120;
  allocator_type local_111;
  Diagnostic *local_110;
  SourceLocation local_108;
  SourceLocation local_100;
  undefined8 local_f8;
  uchar uStack_f0;
  uchar uStack_ef;
  uchar uStack_ee;
  uchar uStack_ed;
  uchar uStack_ec;
  uchar uStack_eb;
  uchar uStack_ea;
  uchar uStack_e9;
  undefined8 local_e8;
  uchar uStack_e0;
  uchar uStack_df;
  uchar uStack_de;
  uchar uStack_dd;
  uchar uStack_dc;
  uchar uStack_db;
  uchar uStack_da;
  uchar uStack_d9;
  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>>
  *local_d8;
  ulong local_d0;
  size_t seed;
  SyntaxNode *pSStack_c0;
  Scope *local_b8;
  bool local_b0;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*> key;
  size_t seed_1;
  pointer local_88;
  pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>
  *ppStack_80;
  undefined1 local_78 [16];
  Scope *local_68;
  pointer local_58;
  group_type_pointer local_50;
  anon_class_16_2_6b3e7b47 reportRedefinition;
  Symbol *local_38;
  
  pRVar5 = (this->root)._M_t.
           super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
           ._M_t.
           super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
           .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
  local_120 = &pRVar5->super_Scope;
  if (pRVar5 == (RootSymbol *)0x0) {
    local_120 = (Scope *)0x0;
  }
  _Var33._M_head_impl = scope;
  if (scope->thisSym->kind == CompilationUnit) {
    _Var33._M_head_impl = local_120;
  }
  key.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl.
  _M_len = (symbol->name)._M_len;
  key.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl.
  _M_str = (symbol->name)._M_str;
  if ((symbol->name)._M_len == 0) {
    return;
  }
  local_110 = (Diagnostic *)&symbol->name;
  local_d8 = (table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>>
              *)&this->definitionMap;
  seed = 0;
  local_130 = (Diagnostic *)scope;
  key.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
  super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
       (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)
       (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)_Var33._M_head_impl;
  reportRedefinition.symbol = symbol;
  reportRedefinition.scope = scope;
  slang::detail::hashing::
  HashValueImpl<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_1UL>
  ::apply(&seed,&key);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = seed;
  uVar19 = SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar8,8) ^
           SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar8,0);
  SVar24 = (SourceLocation)
           (uVar19 >>
           ((byte)(this->definitionMap).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                  .arrays.groups_size_index & 0x3f));
  lVar2 = (uVar19 & 0xff) * 4;
  uVar37 = (&UNK_009584ac)[lVar2];
  uVar38 = (&UNK_009584ad)[lVar2];
  uVar39 = (&UNK_009584ae)[lVar2];
  uVar40 = (&UNK_009584af)[lVar2];
  ppVar31 = (pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool> *)
            (ulong)((uint)uVar19 & 7);
  SVar17 = (SourceLocation)0x0;
  uVar41 = uVar37;
  uVar42 = uVar38;
  uVar43 = uVar39;
  uVar44 = uVar40;
  uVar45 = uVar37;
  uVar46 = uVar38;
  uVar47 = uVar39;
  uVar48 = uVar40;
  uVar49 = uVar37;
  uVar50 = uVar38;
  uVar51 = uVar39;
  uVar52 = uVar40;
  do {
    SVar28 = (SourceLocation)
             (this->definitionMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
             .arrays.groups_;
    uVar19 = (long)SVar24 * 0x10;
    pgVar3 = (group_type_pointer)((long)SVar28 + uVar19);
    auVar34[0] = -(pgVar3->m[0].n == uVar37);
    auVar34[1] = -(pgVar3->m[1].n == uVar38);
    auVar34[2] = -(pgVar3->m[2].n == uVar39);
    auVar34[3] = -(pgVar3->m[3].n == uVar40);
    auVar34[4] = -(pgVar3->m[4].n == uVar41);
    auVar34[5] = -(pgVar3->m[5].n == uVar42);
    auVar34[6] = -(pgVar3->m[6].n == uVar43);
    auVar34[7] = -(pgVar3->m[7].n == uVar44);
    auVar34[8] = -(pgVar3->m[8].n == uVar45);
    auVar34[9] = -(pgVar3->m[9].n == uVar46);
    auVar34[10] = -(pgVar3->m[10].n == uVar47);
    auVar34[0xb] = -(pgVar3->m[0xb].n == uVar48);
    auVar34[0xc] = -(pgVar3->m[0xc].n == uVar49);
    auVar34[0xd] = -(pgVar3->m[0xd].n == uVar50);
    auVar34[0xe] = -(pgVar3->m[0xe].n == uVar51);
    auVar34[0xf] = -(pgVar3->m[0xf].n == uVar52);
    uVar16 = (uint)(ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe);
    local_138 = SVar24;
    if (uVar16 != 0) {
      ppVar32 = (this->definitionMap).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                .arrays.elements_;
      local_e8._0_2_ = CONCAT11(uVar38,uVar37);
      local_e8._0_3_ = CONCAT12(uVar39,(undefined2)local_e8);
      local_e8._0_4_ = CONCAT13(uVar40,(undefined3)local_e8);
      local_e8._0_5_ = CONCAT14(uVar41,(undefined4)local_e8);
      local_e8._0_6_ = CONCAT15(uVar42,(undefined5)local_e8);
      local_e8._0_7_ = CONCAT16(uVar43,(undefined6)local_e8);
      local_e8 = (value_type_pointer)CONCAT17(uVar44,(undefined7)local_e8);
      ppVar21 = unaff_RBX;
      local_128 = ppVar31;
      local_108 = SVar28;
      local_100 = SVar17;
      local_f8 = this;
      uStack_e0 = uVar45;
      uStack_df = uVar46;
      uStack_de = uVar47;
      uStack_dd = uVar48;
      uStack_dc = uVar49;
      uStack_db = uVar50;
      uStack_da = uVar51;
      uStack_d9 = uVar52;
      local_d0 = uVar19;
      do {
        uVar7 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
          }
        }
        unaff_RBX = ppVar32 + (long)SVar24 * 0xf + (ulong)uVar7;
        bVar11 = std::
                 __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_2UL>
                 ::__eq(&key,&unaff_RBX->first);
        if (!bVar11) {
          uVar16 = uVar16 - 1 & uVar16;
          unaff_RBX = ppVar21;
        }
        this = local_f8;
        if (bVar11) goto LAB_0083849b;
        ppVar21 = unaff_RBX;
      } while (uVar16 != 0);
      SVar17 = local_100;
      ppVar31 = local_128;
      SVar28 = local_108;
      uVar19 = local_d0;
      uVar37 = (uchar)local_e8;
      uVar38 = local_e8._1_1_;
      uVar39 = local_e8._2_1_;
      uVar40 = local_e8._3_1_;
      uVar41 = local_e8._4_1_;
      uVar42 = local_e8._5_1_;
      uVar43 = local_e8._6_1_;
      uVar44 = local_e8._7_1_;
      uVar45 = uStack_e0;
      uVar46 = uStack_df;
      uVar47 = uStack_de;
      uVar48 = uStack_dd;
      uVar49 = uStack_dc;
      uVar50 = uStack_db;
      uVar51 = uStack_da;
      uVar52 = uStack_d9;
      if (bVar11) goto LAB_0083849b;
    }
    if ((*(byte *)((long)SVar28 + uVar19 + 0xf) & *(byte *)(ppVar31 + 0x4ac45)) == 0) {
      unaff_RBX = (value_type_pointer)0x0;
      goto LAB_0083849b;
    }
    SVar28 = (SourceLocation)
             (this->definitionMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
             .arrays.groups_size_mask;
    psVar25 = (slot_type *)((long)local_138 + (long)SVar17);
    SVar17 = (SourceLocation)((long)SVar17 + 1);
    SVar24 = (SourceLocation)((ulong)(psVar25 + 1) & (ulong)SVar28);
  } while ((ulong)SVar17 <= (ulong)SVar28);
  unaff_RBX = (value_type_pointer)0x0;
LAB_0083849b:
  if (unaff_RBX == (value_type_pointer)0x0) {
    __l._M_len = 1;
    __l._M_array = &local_38;
    local_38 = symbol;
    std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>::vector
              ((vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *)local_78,__l,
               &local_111);
    __u = local_120;
    local_b0 = _Var33._M_head_impl != local_120;
    seed = local_78._0_8_;
    pSStack_c0 = (SyntaxNode *)local_78._8_8_;
    local_b8 = local_68;
    local_68 = (Scope *)0x0;
    local_78 = (undefined1  [16])0x0;
    seed_1 = 0;
    slang::detail::hashing::
    HashValueImpl<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_1UL>
    ::apply(&seed_1,&key);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = seed_1;
    ppVar31 = (pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>
               *)(SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar9,8) ^
                 SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar9,0));
    SVar24 = (SourceLocation)
             ((ulong)ppVar31 >>
             ((byte)(this->definitionMap).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                    .arrays.groups_size_index & 0x3f));
    lVar2 = ((ulong)ppVar31 & 0xff) * 4;
    uVar37 = (&UNK_009584ac)[lVar2];
    uVar38 = (&UNK_009584ad)[lVar2];
    uVar39 = (&UNK_009584ae)[lVar2];
    uVar40 = (&UNK_009584af)[lVar2];
    SVar17._0_4_ = (uint)ppVar31 & 7;
    SVar17._4_4_ = 0;
    uVar19 = 0;
    SVar28 = SVar24;
    uVar41 = uVar37;
    uVar42 = uVar38;
    uVar43 = uVar39;
    uVar44 = uVar40;
    uVar45 = uVar37;
    uVar46 = uVar38;
    uVar47 = uVar39;
    uVar48 = uVar40;
    uVar49 = uVar37;
    uVar50 = uVar38;
    uVar51 = uVar39;
    uVar52 = uVar40;
    do {
      pgVar27 = (this->definitionMap).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                .arrays.groups_;
      pgVar3 = pgVar27 + (long)SVar24;
      auVar35[0] = -(pgVar3->m[0].n == uVar37);
      auVar35[1] = -(pgVar3->m[1].n == uVar38);
      auVar35[2] = -(pgVar3->m[2].n == uVar39);
      auVar35[3] = -(pgVar3->m[3].n == uVar40);
      auVar35[4] = -(pgVar3->m[4].n == uVar41);
      auVar35[5] = -(pgVar3->m[5].n == uVar42);
      auVar35[6] = -(pgVar3->m[6].n == uVar43);
      auVar35[7] = -(pgVar3->m[7].n == uVar44);
      auVar35[8] = -(pgVar3->m[8].n == uVar45);
      auVar35[9] = -(pgVar3->m[9].n == uVar46);
      auVar35[10] = -(pgVar3->m[10].n == uVar47);
      auVar35[0xb] = -(pgVar3->m[0xb].n == uVar48);
      auVar35[0xc] = -(pgVar3->m[0xc].n == uVar49);
      auVar35[0xd] = -(pgVar3->m[0xd].n == uVar50);
      auVar35[0xe] = -(pgVar3->m[0xe].n == uVar51);
      auVar35[0xf] = -(pgVar3->m[0xf].n == uVar52);
      uVar16 = (uint)(ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe);
      uVar26 = uVar19;
      ppSVar30 = (pointer)((long)SVar24 * 0x10);
      if (uVar16 != 0) {
        local_e8 = (this->definitionMap).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                   .arrays.elements_ + (long)SVar24 * 0xf;
        local_f8 = (Compilation *)
                   CONCAT17(uVar44,CONCAT16(uVar43,CONCAT15(uVar42,CONCAT14(uVar41,CONCAT13(uVar40,
                                                  CONCAT12(uVar39,CONCAT11(uVar38,uVar37)))))));
        local_138 = SVar28;
        local_128 = ppVar31;
        local_108 = SVar24;
        local_100 = SVar17;
        uStack_f0 = uVar45;
        uStack_ef = uVar46;
        uStack_ee = uVar47;
        uStack_ed = uVar48;
        uStack_ec = uVar49;
        uStack_eb = uVar50;
        uStack_ea = uVar51;
        uStack_e9 = uVar52;
        local_d0 = uVar19;
        local_58 = (pointer)((long)SVar24 * 0x10);
        local_50 = pgVar27;
        do {
          uVar7 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
            }
          }
          ppVar32 = local_e8 + uVar7;
          bVar11 = std::
                   __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_2UL>
                   ::__eq(&key,&ppVar32->first);
          __u = local_120;
          SVar28 = local_138;
          ppVar31 = local_128;
          if (bVar11) goto LAB_008388f8;
          uVar16 = uVar16 - 1 & uVar16;
        } while (uVar16 != 0);
        SVar17 = local_100;
        SVar24 = local_108;
        uVar26 = local_d0;
        pgVar27 = local_50;
        ppSVar30 = local_58;
        ppVar32 = (value_type_pointer)local_78;
        uVar37 = (uchar)local_f8;
        uVar38 = local_f8._1_1_;
        uVar39 = local_f8._2_1_;
        uVar40 = local_f8._3_1_;
        uVar41 = local_f8._4_1_;
        uVar42 = local_f8._5_1_;
        uVar43 = local_f8._6_1_;
        uVar44 = local_f8._7_1_;
        uVar45 = uStack_f0;
        uVar46 = uStack_ef;
        uVar47 = uStack_ee;
        uVar48 = uStack_ed;
        uVar49 = uStack_ec;
        uVar50 = uStack_eb;
        uVar51 = uStack_ea;
        uVar52 = uStack_e9;
        if (bVar11) goto LAB_008388f8;
      }
      if ((((slot_type *)((long)ppSVar30 + (long)(pgVar27->m + 0xf)))->n &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[(long)SVar17]) == 0) break;
      uVar6 = (this->definitionMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
              .arrays.groups_size_mask;
      uVar19 = uVar26 + 1;
      SVar24 = (SourceLocation)((long)SVar24 + uVar26 + 1 & uVar6);
    } while (uVar19 <= uVar6);
    ppVar32 = (value_type_pointer)0x0;
LAB_008388f8:
    if (ppVar32 == (value_type_pointer)0x0) {
      if ((this->definitionMap).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
          .size_ctrl.size <
          (this->definitionMap).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
          .size_ctrl.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>>
        ::
        nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>&,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>
                  ((locator *)&seed_1,local_d8,(arrays_type *)local_d8,(size_t)SVar28,
                   (size_t)ppVar31,&local_139,&key,
                   (pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>
                    *)&seed);
        psVar1 = &(this->definitionMap).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                  .size_ctrl.size;
        *psVar1 = *psVar1 + 1;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>&,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>
                  ((locator *)&seed_1,local_d8,(size_t)ppVar31,&local_139,&key,
                   (pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>
                    *)&seed);
      }
    }
    if (seed != 0) {
      operator_delete((void *)seed,(long)local_b8 - seed);
    }
    if ((Scope *)local_78._0_8_ != (Scope *)0x0) {
      operator_delete((void *)local_78._0_8_,(long)local_68 - local_78._0_8_);
    }
    goto LAB_0083898d;
  }
  if (_Var33._M_head_impl != local_120) {
    if ((local_110->args).
        super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      return;
    }
    SVar17 = (*(unaff_RBX->second).first.
               super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
               _M_impl.super__Vector_impl_data._M_start)->location;
    pDVar12 = Scope::addDiag((Scope *)local_130,(DiagCode)0x40000a,symbol->location);
    Diagnostic::operator<<(pDVar12,symbol->name);
    Diagnostic::addNote(pDVar12,(DiagCode)0xa0001,SVar17);
    return;
  }
  __position._M_current =
       (unaff_RBX->second).first.
       super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_128 = &unaff_RBX->second;
  uVar19 = (long)(unaff_RBX->second).first.
                 super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)__position._M_current >> 3;
  local_e8 = unaff_RBX;
  while (uVar26 = uVar19, local_f8 = this, 0 < (long)uVar26) {
    uVar19 = uVar26 >> 1;
    pSVar13 = Symbol::getSourceLibrary(*(pointer)((long)__position._M_current + uVar19 * 8));
    pSVar14 = Symbol::getSourceLibrary(symbol);
    this = local_f8;
    if (pSVar13->priority < pSVar14->priority) {
      __position._M_current = (pointer)((long)__position._M_current + uVar19 * 8) + 1;
      uVar19 = ~uVar19 + uVar26;
    }
  }
  if (__position._M_current ==
      (local_e8->second).first.
      super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
LAB_008388bd:
    __u = local_120;
    seed = (size_t)symbol;
    std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>::_M_insert_rval
              (&local_128->first,__position,(value_type *)&seed);
    iVar23 = 0;
  }
  else {
    pSVar13 = Symbol::getSourceLibrary(symbol);
    local_108 = (SourceLocation)__position._M_current;
    if (__position._M_current !=
        (local_e8->second).first.
        super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_138 = (SourceLocation)((ulong)local_138 & 0xffffffff00000000);
      do {
        this_00 = *__position._M_current;
        pSVar14 = Symbol::getSourceLibrary(this_00);
        if (pSVar14 == pSVar13) {
          if (this_00->kind == symbol->kind) {
            iVar23 = 0;
            bVar11 = true;
            if (((ulong)local_138 & 1) == 0) {
              pDVar12 = local_110;
              if ((local_110->args).
                  super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                local_138 = this_00->location;
                pDVar12 = Scope::addDiag((Scope *)local_130,(DiagCode)0x40000a,symbol->location);
                Diagnostic::operator<<(pDVar12,symbol->name);
                pDVar12 = Diagnostic::addNote(pDVar12,(DiagCode)0xa0001,local_138);
              }
              iVar23 = 0;
              local_138._0_4_ = (int)CONCAT71((int7)((ulong)pDVar12 >> 8),1);
              bVar11 = true;
            }
          }
          else {
            if ((local_110->args).
                super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              local_100 = this_00->location;
              pDVar12 = Scope::addDiag((Scope *)local_130,(DiagCode)0x2a000a,symbol->location);
              Diagnostic::operator<<(pDVar12,symbol->name);
              Diagnostic::addNote(pDVar12,(DiagCode)0xa0001,local_100);
            }
            iVar23 = 1;
            bVar11 = false;
          }
        }
        else {
          bVar11 = pSVar14->priority == pSVar13->priority;
          iVar23 = 6;
          if (bVar11) {
            iVar23 = 0;
          }
        }
        if (!bVar11) goto LAB_008388a9;
        __position._M_current = __position._M_current + 8;
      } while (__position._M_current !=
               (local_e8->second).first.
               super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    iVar23 = 6;
LAB_008388a9:
    __u = local_120;
    __position._M_current = (Symbol **)local_108;
    if (iVar23 == 6) goto LAB_008388bd;
  }
  if (iVar23 != 0) {
    return;
  }
LAB_0083898d:
  if (_Var33._M_head_impl == __u) {
    pSVar15 = getExternDefinition(this,symbol->name,(Scope *)local_130);
    if (pSVar15 != (SyntaxNode *)0x0) {
      if (symbol->kind == Definition && pSVar15->kind == ExternModuleDecl) {
        checkExternModMatch((Scope *)local_130,(ModuleHeaderSyntax *)pSVar15[6].parent,
                            (ModuleHeaderSyntax *)symbol->originatingSyntax[3].parent,
                            (DiagCode)0xb000d);
      }
      else if (symbol->kind == Primitive && pSVar15->kind == ExternUdpDecl) {
        name._M_str = (char *)0xb000d;
        name._M_len = (size_t)(symbol->name)._M_str;
        checkExternUdpMatch((ast *)local_130,(Scope *)pSVar15[7].previewNode,
                            (UdpPortListSyntax *)symbol->originatingSyntax[4].previewNode,
                            (UdpPortListSyntax *)(symbol->name)._M_len,name,
                            in_stack_fffffffffffffeb8);
      }
      else {
        if (pSVar15->kind == ExternModuleDecl) {
          pSVar15 = (SyntaxNode *)&pSVar15[6].parent[2].parent;
        }
        else {
          pSVar15 = pSVar15 + 7;
        }
        seed = *(size_t *)pSVar15;
        pSStack_c0 = pSVar15->parent;
        SVar17 = parsing::Token::location((Token *)&seed);
        insertDefinition::anon_class_16_2_6b3e7b47::operator()
                  (&reportRedefinition,SVar17,(DiagCode)0x2a000a);
      }
    }
  }
  else {
    pRVar5 = (this->root)._M_t.
             super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
             ._M_t.
             super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
             .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
    local_88 = (local_110->args).
               super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppStack_80 = (pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>
                  *)(local_110->args).
                    super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
    seed_1 = (size_t)&pRVar5->super_Scope;
    if (pRVar5 == (RootSymbol *)0x0) {
      seed_1 = 0;
    }
    seed = 0;
    slang::detail::hashing::
    HashValueImpl<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_1UL>
    ::apply(&seed,(tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                   *)&seed_1);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = seed;
    hash = (Compilation *)
           (SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar10,8) ^
           SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar10,0));
    pDVar29 = (Diagnostic *)
              ((ulong)hash >>
              ((byte)(this->definitionMap).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                     .arrays.groups_size_index & 0x3f));
    lVar2 = ((ulong)hash & 0xff) * 4;
    uVar37 = (&UNK_009584ac)[lVar2];
    uVar38 = (&UNK_009584ad)[lVar2];
    uVar39 = (&UNK_009584ae)[lVar2];
    uVar40 = (&UNK_009584af)[lVar2];
    pSVar18 = (Scope *)(ulong)((uint)hash & 7);
    SVar17 = (SourceLocation)0x0;
    pDVar12 = pDVar29;
    uVar41 = uVar37;
    uVar42 = uVar38;
    uVar43 = uVar39;
    uVar44 = uVar40;
    uVar45 = uVar37;
    uVar46 = uVar38;
    uVar47 = uVar39;
    uVar48 = uVar40;
    uVar49 = uVar37;
    uVar50 = uVar38;
    uVar51 = uVar39;
    uVar52 = uVar40;
    do {
      ppVar31 = (pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>
                 *)(this->definitionMap).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                   .arrays.groups_;
      pppSVar4 = &(ppVar31->first).
                  super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>.
                  _M_impl.super__Vector_impl_data._M_start + (long)pDVar29 * 2;
      auVar36[0] = -(*(uchar *)pppSVar4 == uVar37);
      auVar36[1] = -(*(uchar *)((long)pppSVar4 + 1) == uVar38);
      auVar36[2] = -(*(uchar *)((long)pppSVar4 + 2) == uVar39);
      auVar36[3] = -(*(uchar *)((long)pppSVar4 + 3) == uVar40);
      auVar36[4] = -(*(uchar *)((long)pppSVar4 + 4) == uVar41);
      auVar36[5] = -(*(uchar *)((long)pppSVar4 + 5) == uVar42);
      auVar36[6] = -(*(uchar *)((long)pppSVar4 + 6) == uVar43);
      auVar36[7] = -(*(uchar *)((long)pppSVar4 + 7) == uVar44);
      auVar36[8] = -(*(uchar *)(pppSVar4 + 1) == uVar45);
      auVar36[9] = -(*(uchar *)((long)pppSVar4 + 9) == uVar46);
      auVar36[10] = -(*(uchar *)((long)pppSVar4 + 10) == uVar47);
      auVar36[0xb] = -(*(uchar *)((long)pppSVar4 + 0xb) == uVar48);
      auVar36[0xc] = -(*(uchar *)((long)pppSVar4 + 0xc) == uVar49);
      auVar36[0xd] = -(*(uchar *)((long)pppSVar4 + 0xd) == uVar50);
      auVar36[0xe] = -(*(uchar *)((long)pppSVar4 + 0xe) == uVar51);
      auVar36[0xf] = -(*(uchar *)((long)pppSVar4 + 0xf) == uVar52);
      uVar16 = (uint)(ushort)((ushort)(SUB161(auVar36 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar36 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar36 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar36 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar36 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar36 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar36 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar36 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar36 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar36 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar36 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar36 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar36 >> 0x77,0) & 1) << 0xe);
      pDVar20 = pDVar29;
      SVar24 = SVar17;
      if (uVar16 != 0) {
        ppVar32 = (this->definitionMap).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                  .arrays.elements_;
        local_e8._0_2_ = CONCAT11(uVar38,uVar37);
        local_e8._0_3_ = CONCAT12(uVar39,(undefined2)local_e8);
        local_e8._0_4_ = CONCAT13(uVar40,(undefined3)local_e8);
        local_e8._0_5_ = CONCAT14(uVar41,(undefined4)local_e8);
        local_e8._0_6_ = CONCAT15(uVar42,(undefined5)local_e8);
        local_e8._0_7_ = CONCAT16(uVar43,(undefined6)local_e8);
        local_e8 = (value_type_pointer)CONCAT17(uVar44,(undefined7)local_e8);
        pSVar22 = __u;
        local_138 = SVar17;
        local_130 = pDVar12;
        local_128 = ppVar31;
        local_120 = pSVar18;
        local_110 = pDVar29;
        local_f8 = hash;
        uStack_e0 = uVar45;
        uStack_df = uVar46;
        uStack_de = uVar47;
        uStack_dd = uVar48;
        uStack_dc = uVar49;
        uStack_db = uVar50;
        uStack_da = uVar51;
        uStack_d9 = uVar52;
        do {
          uVar7 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
            }
          }
          __u = (Scope *)(ppVar32 + (long)pDVar29 * 0xf + (ulong)uVar7);
          bVar11 = std::
                   __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_2UL>
                   ::__eq((tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                           *)&seed_1,
                          (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                           *)__u);
          if (!bVar11) {
            uVar16 = uVar16 - 1 & uVar16;
            __u = pSVar22;
          }
          pDVar12 = local_130;
          hash = local_f8;
          if (bVar11) goto LAB_00838bf5;
          pSVar22 = __u;
        } while (uVar16 != 0);
        pSVar18 = local_120;
        pDVar20 = local_110;
        SVar24 = local_138;
        ppVar31 = local_128;
        uVar37 = (uchar)local_e8;
        uVar38 = local_e8._1_1_;
        uVar39 = local_e8._2_1_;
        uVar40 = local_e8._3_1_;
        uVar41 = local_e8._4_1_;
        uVar42 = local_e8._5_1_;
        uVar43 = local_e8._6_1_;
        uVar44 = local_e8._7_1_;
        uVar45 = uStack_e0;
        uVar46 = uStack_df;
        uVar47 = uStack_de;
        uVar48 = uStack_dd;
        uVar49 = uStack_dc;
        uVar50 = uStack_db;
        uVar51 = uStack_da;
        uVar52 = uStack_d9;
        if (bVar11) goto LAB_00838bf5;
      }
      if ((*(byte *)((long)&(ppVar31->first).
                            super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish + (long)pDVar29 * 0x10 + 7) &
          *(byte *)&pSVar18[0x2ab95].thisSym) == 0) break;
      SVar28 = (SourceLocation)
               (this->definitionMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
               .arrays.groups_size_mask;
      SVar17 = (SourceLocation)((long)SVar24 + 1);
      pDVar29 = (Diagnostic *)
                ((ulong)((slot_type *)((long)SVar24 + 1) +
                        (long)&(pDVar20->args).
                               super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                        ) & (ulong)SVar28);
    } while ((ulong)SVar17 <= (ulong)SVar28);
    __u = (Scope *)0x0;
LAB_00838bf5:
    if (__u == (Scope *)0x0) {
      if ((this->definitionMap).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
          .size_ctrl.size <
          (this->definitionMap).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
          .size_ctrl.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>>
        ::
        nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>
                  ((locator *)&seed,local_d8,(arrays_type *)local_d8,(size_t)pDVar12,(size_t)hash,
                   (try_emplace_args_t *)local_78,
                   (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                    *)&seed_1);
        psVar1 = &(this->definitionMap).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                  .size_ctrl.size;
        *psVar1 = *psVar1 + 1;
        __u = local_b8;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::pair<std::vector<slang::ast::Symbol*,std::allocator<slang::ast::Symbol*>>,bool>>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>
                  ((locator *)&seed,local_d8,(size_t)hash,(try_emplace_args_t *)local_78,
                   (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                    *)&seed_1);
        __u = local_b8;
      }
    }
    *(undefined1 *)&__u->importData = 1;
  }
  return;
}

Assistant:

void Compilation::insertDefinition(Symbol& symbol, const Scope& scope) {
    SLANG_ASSERT(!isFrozen());

    auto reportRedefinition = [&](SourceLocation oldLoc, DiagCode code) {
        if (!symbol.name.empty()) {
            auto& diag = scope.addDiag(code, symbol.location);
            diag << symbol.name;
            diag.addNote(diag::NotePreviousDefinition, oldLoc);
        }
    };

    // Record that the given scope contains this definition. If the scope is a compilation unit, add
    // it to the root scope instead so that lookups from other compilation units will find it.
    auto targetScope = scope.asSymbol().kind == SymbolKind::CompilationUnit ? root.get() : &scope;
    const bool isRoot = targetScope == root.get();
    auto key = std::tuple(symbol.name, targetScope);
    if (symbol.name.empty())
        return;

    if (auto it = definitionMap.find(key); it != definitionMap.end()) {
        // There is already a definition with this name in this scope.
        // If we're not at the root scope, it's a straightforward error.
        auto& defList = it->second.first;
        if (!isRoot) {
            SLANG_ASSERT(defList[0]);
            reportRedefinition(defList[0]->location, diag::DuplicateDefinition);
            return;
        }

        // Otherwise we have a duplicate at the root scope; figure out where
        // we should insert this definition. If they are in different libraries
        // then keep them sorted in priority order. If they're in the same library
        // then we want to error (or maybe warn).
        auto vecIt = std::ranges::lower_bound(defList, &symbol, [](auto a, auto b) {
            auto libA = a->getSourceLibrary();
            auto libB = b->getSourceLibrary();
            SLANG_ASSERT(libA && libB);
            return libA->priority < libB->priority;
        });

        if (vecIt != defList.end()) {
            bool warned = false;
            auto symLib = symbol.getSourceLibrary();
            for (auto v = vecIt; v != defList.end(); v++) {
                auto vSym = *v;
                auto vLib = vSym->getSourceLibrary();
                if (vLib == symLib) {
                    // Duplicate in the same library. If they are both the same kind
                    // then we report a warning and take the first one, otherwise
                    // we give a hard error.
                    if (vSym->kind == symbol.kind) {
                        if (!warned) {
                            // We keep going after this because there might also
                            // be a mismatching primitive / definition worth erroring about
                            // and the DuplicateDefinition warning can be suppressed.
                            reportRedefinition(vSym->location, diag::DuplicateDefinition);
                            warned = true;
                        }
                    }
                    else {
                        reportRedefinition(vSym->location, diag::Redefinition);
                        return;
                    }
                }
                else if (vLib->priority != symLib->priority) {
                    // We know for sure there are no more duplicates because the
                    // library and/or the priority has changed.
                    break;
                }
            }
        }

        defList.insert(vecIt, &symbol);
    }
    else {
        definitionMap.emplace(key, std::pair{std::vector{&symbol}, !isRoot});
    }

    if (isRoot) {
        // TODO: how do extern modules work with libraries?
        if (auto externDef = getExternDefinition(symbol.name, scope)) {
            auto syntax = symbol.getSyntax();
            SLANG_ASSERT(syntax);

            if (externDef->kind == SyntaxKind::ExternModuleDecl &&
                symbol.kind == SymbolKind::Definition) {
                checkExternModMatch(scope, *externDef->as<ExternModuleDeclSyntax>().header,
                                    *syntax->as<ModuleDeclarationSyntax>().header,
                                    diag::ExternDeclMismatchImpl);
            }
            else if (externDef->kind == SyntaxKind::ExternUdpDecl &&
                     symbol.kind == SymbolKind::Primitive) {
                checkExternUdpMatch(scope, *externDef->as<ExternUdpDeclSyntax>().portList,
                                    *syntax->as<UdpDeclarationSyntax>().portList, symbol.name,
                                    diag::ExternDeclMismatchImpl);
            }
            else {
                reportRedefinition(getExternNameToken(*externDef).location(), diag::Redefinition);
            }
        }
    }
    else {
        // Record the fact that we have nested modules with this name.
        definitionMap[std::tuple(symbol.name, root.get())].second = true;
    }
}